

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O0

void VP8LHuffmanTablesDeallocate(HuffmanTables *huffman_tables)

{
  undefined8 *in_RDI;
  HuffmanTablesSegment *next;
  HuffmanTablesSegment *current;
  long local_10;
  
  if (in_RDI != (undefined8 *)0x0) {
    local_10 = in_RDI[2];
    WebPSafeFree((void *)0x15f987);
    *in_RDI = 0;
    in_RDI[2] = 0;
    while (local_10 != 0) {
      local_10 = *(long *)(local_10 + 0x10);
      WebPSafeFree((void *)0x15f9cb);
      WebPSafeFree((void *)0x15f9d5);
    }
  }
  return;
}

Assistant:

void VP8LHuffmanTablesDeallocate(HuffmanTables* const huffman_tables) {
  HuffmanTablesSegment *current, *next;
  if (huffman_tables == NULL) return;
  // Free the root node.
  current = &huffman_tables->root;
  next = current->next;
  WebPSafeFree(current->start);
  current->start = NULL;
  current->next = NULL;
  current = next;
  // Free the following nodes.
  while (current != NULL) {
    next = current->next;
    WebPSafeFree(current->start);
    WebPSafeFree(current);
    current = next;
  }
}